

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O3

void __thiscall cmMakefile::SetCurrentSourceDirectory(cmMakefile *this,string *dir)

{
  char *value;
  string local_38;
  
  cmState::Snapshot::SetCurrentSourceDirectory(&this->StateSnapshot,dir);
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"CMAKE_CURRENT_SOURCE_DIR","")
  ;
  value = cmState::Snapshot::GetCurrentSourceDirectory(&this->StateSnapshot);
  AddDefinition(this,&local_38,value);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmMakefile::SetCurrentSourceDirectory(const std::string& dir)
{
  this->StateSnapshot.SetCurrentSourceDirectory(dir);
  this->AddDefinition("CMAKE_CURRENT_SOURCE_DIR",
                      this->StateSnapshot.GetCurrentSourceDirectory());
}